

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O0

void helper_svm_check_io_x86_64
               (CPUX86State *env,uint32_t port,uint32_t param,uint32_t next_eip_addend)

{
  uint32_t uVar1;
  CPUState *cs_00;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  uint16_t mask;
  uint64_t addr;
  CPUState *cs;
  uint32_t next_eip_addend_local;
  uint32_t param_local;
  uint32_t port_local;
  CPUX86State *env_local;
  
  cs_00 = env_cpu(env);
  if ((env->intercept & 0x8000000) != 0) {
    uVar2 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x40);
    uVar1 = x86_lduw_phys_x86_64(cs_00,uVar2 + (port >> 3));
    if ((uVar1 & (uint)(ushort)((short)(1 << ((byte)(param >> 4) & 7)) - 1) << ((byte)port & 7)) !=
        0) {
      x86_stq_phys_x86_64(cs_00,env->vm_vmcb + 0x80,env->eip + (ulong)next_eip_addend);
      cpu_vmexit_x86_64(env,0x7b,(ulong)(param | port << 0x10),unaff_retaddr);
    }
  }
  return;
}

Assistant:

void helper_svm_check_io(CPUX86State *env, uint32_t port, uint32_t param,
                         uint32_t next_eip_addend)
{
    CPUState *cs = env_cpu(env);

    if (env->intercept & (1ULL << (SVM_EXIT_IOIO - SVM_EXIT_INTR))) {
        /* FIXME: this should be read in at vmrun (faster this way?) */
        uint64_t addr = x86_ldq_phys(cs, env->vm_vmcb +
                                 offsetof(struct vmcb, control.iopm_base_pa));
        uint16_t mask = (1 << ((param >> 4) & 7)) - 1;

        if (x86_lduw_phys(cs, addr + port / 8) & (mask << (port & 7))) {
            /* next env->eip */
            x86_stq_phys(cs,
                     env->vm_vmcb + offsetof(struct vmcb, control.exit_info_2),
                     env->eip + next_eip_addend);
            cpu_vmexit(env, SVM_EXIT_IOIO, param | (port << 16), GETPC());
        }
    }
}